

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O0

wchar_t archive_read_disk_set_gname_lookup
                  (archive *_a,void *private_data,_func_char_ptr_void_ptr_int64_t *lookup_gname,
                  _func_void_void_ptr *cleanup_gname)

{
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  wchar_t magic_test;
  archive_read_disk *a;
  char *in_stack_00000068;
  uint in_stack_00000070;
  uint in_stack_00000074;
  archive *in_stack_00000078;
  undefined4 local_4;
  
  iVar1 = __archive_check_magic
                    (in_stack_00000078,in_stack_00000074,in_stack_00000070,in_stack_00000068);
  if (iVar1 == -0x1e) {
    local_4 = L'\xffffffe2';
  }
  else {
    if ((*(long *)(in_RDI + 0xb0) != 0) && (*(long *)(in_RDI + 0xb8) != 0)) {
      (**(code **)(in_RDI + 0xb0))(*(undefined8 *)(in_RDI + 0xb8));
    }
    *(undefined8 *)(in_RDI + 0xa8) = in_RDX;
    *(undefined8 *)(in_RDI + 0xb0) = in_RCX;
    *(undefined8 *)(in_RDI + 0xb8) = in_RSI;
    local_4 = L'\0';
  }
  return local_4;
}

Assistant:

int
archive_read_disk_set_gname_lookup(struct archive *_a,
    void *private_data,
    const char * (*lookup_gname)(void *private, int64_t gid),
    void (*cleanup_gname)(void *private))
{
	struct archive_read_disk *a = (struct archive_read_disk *)_a;
	archive_check_magic(&a->archive, ARCHIVE_READ_DISK_MAGIC,
	    ARCHIVE_STATE_ANY, "archive_read_disk_set_gname_lookup");

	if (a->cleanup_gname != NULL && a->lookup_gname_data != NULL)
		(a->cleanup_gname)(a->lookup_gname_data);

	a->lookup_gname = lookup_gname;
	a->cleanup_gname = cleanup_gname;
	a->lookup_gname_data = private_data;
	return (ARCHIVE_OK);
}